

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerator.cxx
# Opt level: O0

bool __thiscall
cmQtAutoGenerator::InfoT::GetStringConfig(InfoT *this,string *key,string *value,bool required)

{
  bool bVar1;
  ulong uVar2;
  string_view key_00;
  cmAlphaNum local_1c0;
  cmAlphaNum local_190;
  string local_160;
  string_view local_140;
  String local_130;
  int local_10c;
  cmAlphaNum local_108;
  cmAlphaNum local_d8;
  string local_a8;
  string_view local_88;
  Value *local_68;
  Value *jval;
  char *local_58;
  undefined1 local_50 [8];
  string configKey;
  bool required_local;
  string *value_local;
  string *key_local;
  InfoT *this_local;
  
  configKey.field_2._M_local_buf[0xf] = required;
  key_00 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)key);
  local_58 = key_00._M_str;
  jval = (Value *)key_00._M_len;
  ConfigKey_abi_cxx11_((string *)local_50,this,key_00);
  local_68 = Json::Value::operator[](&this->Json_,(string *)local_50);
  bVar1 = Json::Value::isNull(local_68);
  if (bVar1) {
    local_10c = 0;
  }
  else {
    bVar1 = Json::Value::isString(local_68);
    if (bVar1) {
      Json::Value::asString_abi_cxx11_(&local_130,local_68);
      std::__cxx11::string::operator=((string *)value,(string *)&local_130);
      std::__cxx11::string::~string((string *)&local_130);
      if (((configKey.field_2._M_local_buf[0xf] & 1U) == 0) ||
         (uVar2 = std::__cxx11::string::empty(), (uVar2 & 1) == 0)) {
        this_local._7_1_ = 1;
        local_10c = 1;
      }
      else {
        cmAlphaNum::cmAlphaNum(&local_190,(string *)local_50);
        cmAlphaNum::cmAlphaNum(&local_1c0," is empty.");
        cmStrCat<>(&local_160,&local_190,&local_1c0);
        local_140 = (string_view)
                    std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_160);
        this_local._7_1_ = LogError(this,local_140);
        std::__cxx11::string::~string((string *)&local_160);
        local_10c = 1;
      }
    }
    else {
      cmAlphaNum::cmAlphaNum(&local_d8,(string *)local_50);
      cmAlphaNum::cmAlphaNum(&local_108," is not a string.");
      cmStrCat<>(&local_a8,&local_d8,&local_108);
      local_88 = (string_view)
                 std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_a8);
      this_local._7_1_ = LogError(this,local_88);
      std::__cxx11::string::~string((string *)&local_a8);
      local_10c = 1;
    }
  }
  std::__cxx11::string::~string((string *)local_50);
  if (local_10c == 0) {
    this_local._7_1_ = GetString(this,key,value,(bool)(configKey.field_2._M_local_buf[0xf] & 1));
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmQtAutoGenerator::InfoT::GetStringConfig(std::string const& key,
                                               std::string& value,
                                               bool required) const
{
  { // Try config
    std::string const configKey = this->ConfigKey(key);
    Json::Value const& jval = this->Json_[configKey];
    if (!jval.isNull()) {
      if (!jval.isString()) {
        return this->LogError(cmStrCat(configKey, " is not a string."));
      }
      value = jval.asString();
      if (required && value.empty()) {
        return this->LogError(cmStrCat(configKey, " is empty."));
      }
      return true;
    }
  }
  // Try plain
  return this->GetString(key, value, required);
}